

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O3

bool duckdb::ValueOperations::DistinctGreaterThanEquals(Value *left,Value *right)

{
  byte bVar1;
  bool bVar2;
  
  if (((right->is_null | left->is_null) & 1U) == 0) {
    bVar2 = TemplatedBooleanOperation<duckdb::GreaterThan>(right,left);
    bVar1 = !bVar2;
  }
  else {
    bVar1 = right->is_null ^ 1U | left->is_null;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ValueOperations::DistinctGreaterThanEquals(const Value &left, const Value &right) {
	return !ValueOperations::DistinctGreaterThan(right, left);
}